

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool DivisionCornerCaseHelper<long_long,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (unsigned_long lhs,
               SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  ulong local_28;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  
  if (rhs.m_int < 1) {
    if (rhs.m_int == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    bVar1 = DivisionNegativeCornerCaseHelper<long_long,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::NegativeCornerCase(lhs,rhs,result);
    if (bVar1) {
      return true;
    }
    local_28 = (ulong)((ulong)rhs.m_int <= lhs);
  }
  else {
    local_28 = lhs / (ulong)rhs.m_int;
  }
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_long_long>(&local_20,&local_28);
  result->m_int = (longlong)local_20;
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }